

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

raft_params * __thiscall nuraft::raft_server::get_current_params(raft_server *this)

{
  element_type *__src;
  context *in_RSI;
  raft_params *in_RDI;
  raft_params *this_00;
  
  this_00 = in_RDI;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x32acb3);
  nuraft::context::get_params(in_RSI);
  __src = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)this_00);
  memcpy(in_RDI,__src,0x68);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x32ace5);
  return this_00;
}

Assistant:

raft_params raft_server::get_current_params() const {
    return *ctx_->get_params();
}